

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picnic3_tree.c
# Opt level: O2

void hashSeed(uint8_t *digest,uint8_t *inputSeed,uint8_t *salt,uint8_t hashPrefix,uint repIndex,
             uint nodeIndex,picnic_instance_t *params)

{
  undefined3 in_register_00000009;
  undefined4 in_register_0000008c;
  hash_context ctx;
  
  hash_init_prefix(&ctx,(ulong)*(byte *)(CONCAT44(in_register_0000008c,nodeIndex) + 6),'\x01');
  hash_update(&ctx,inputSeed,(ulong)*(byte *)(CONCAT44(in_register_0000008c,nodeIndex) + 7));
  Keccak_HashUpdate(&ctx,salt,0x100);
  hash_update_uint16_le(&ctx,(uint16_t)CONCAT31(in_register_00000009,hashPrefix));
  hash_update_uint16_le(&ctx,(uint16_t)repIndex);
  hash_final(&ctx);
  hash_squeeze(&ctx,digest,
               (ulong)((uint)*(byte *)(CONCAT44(in_register_0000008c,nodeIndex) + 7) * 2));
  return;
}

Assistant:

static void hashSeed(uint8_t* digest, const uint8_t* inputSeed, uint8_t* salt, uint8_t hashPrefix,
                     unsigned int repIndex, unsigned int nodeIndex,
                     const picnic_instance_t* params) {
  hash_context ctx;

  hash_init_prefix(&ctx, params->digest_size, hashPrefix);
  hash_update(&ctx, inputSeed, params->seed_size);
  hash_update(&ctx, salt, SALT_SIZE);
  hash_update_uint16_le(&ctx, repIndex);
  hash_update_uint16_le(&ctx, nodeIndex);
  hash_final(&ctx);
  hash_squeeze(&ctx, digest, 2 * params->seed_size);
  hash_clear(&ctx);
}